

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall FIX::double_conversion::Bignum::Clamp(Bignum *this)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  
  iVar1 = this->used_digits_;
  iVar4 = iVar1;
  if (0 < (long)iVar1) {
    iVar2 = (this->bigits_).length_;
    puVar3 = (this->bigits_).start_;
    uVar5 = (long)iVar1 + 1;
    do {
      iVar4 = iVar4 + -1;
      if (iVar2 < iVar1) {
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      if (puVar3[uVar5 - 2] != 0) {
        return;
      }
      this->used_digits_ = iVar4;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  if (iVar4 == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::Clamp() {
  while (used_digits_ > 0 && bigits_[used_digits_ - 1] == 0) {
    used_digits_--;
  }
  if (used_digits_ == 0) {
    // Zero.
    exponent_ = 0;
  }
}